

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directed_Energy_Fire_PDU.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::Directed_Energy_Fire_PDU::Directed_Energy_Fire_PDU
          (Directed_Energy_Fire_PDU *this,EntityIdentifier *FireID,EntityIdentifier *EventID,
          EntityType *MunitionType,ClockTime *ShotStartTime,KFLOAT32 CumulativeShotTime,
          Vector *EmitterLocation,KFLOAT32 ApertureDiameter,KFLOAT32 Wavelength,
          KFLOAT32 PeakIrradiance,KFLOAT32 PulseRepetitionFrequency,KFLOAT32 PulseWidth,
          KBOOL WeaponState,KBOOL UpdateState,BeamSpotShape PS)

{
  undefined2 uVar1;
  KUINT16 KVar2;
  KUINT8 KVar3;
  KUINT8 KVar4;
  KUINT8 KVar5;
  KUINT8 KVar6;
  KUINT8 KVar7;
  KUINT32 KVar8;
  KFLOAT32 KVar9;
  
  Header7::Header7(&this->super_Header);
  (this->super_Header).super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Directed_Energy_Fire_PDU_00217568;
  (this->m_FiringEntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__SimulationIdentifier_00217f20;
  KVar2 = (FireID->super_SimulationIdentifier).m_ui16ApplicationID;
  (this->m_FiringEntityID).super_SimulationIdentifier.m_ui16SiteID =
       (FireID->super_SimulationIdentifier).m_ui16SiteID;
  (this->m_FiringEntityID).super_SimulationIdentifier.m_ui16ApplicationID = KVar2;
  (this->m_FiringEntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__EntityIdentifier_00217bc0;
  *(undefined2 *)&(this->m_FiringEntityID).super_SimulationIdentifier.field_0xc =
       *(undefined2 *)&(FireID->super_SimulationIdentifier).field_0xc;
  (this->m_EventID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__SimulationIdentifier_00217f20;
  KVar2 = (EventID->super_SimulationIdentifier).m_ui16ApplicationID;
  (this->m_EventID).super_SimulationIdentifier.m_ui16SiteID =
       (EventID->super_SimulationIdentifier).m_ui16SiteID;
  (this->m_EventID).super_SimulationIdentifier.m_ui16ApplicationID = KVar2;
  (this->m_EventID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__EntityIdentifier_00217bc0;
  *(undefined2 *)&(this->m_EventID).super_SimulationIdentifier.field_0xc =
       *(undefined2 *)&(EventID->super_SimulationIdentifier).field_0xc;
  (this->m_MunTyp).super_DataTypeBase._vptr_DataTypeBase = (_func_int **)&PTR__DataTypeBase_00217c70
  ;
  KVar3 = MunitionType->m_ui8Domain;
  KVar2 = MunitionType->m_ui16Country;
  KVar4 = MunitionType->m_ui8Category;
  KVar5 = MunitionType->m_ui8SubCategory;
  KVar6 = MunitionType->m_ui8Specific;
  KVar7 = MunitionType->m_ui8Extra;
  (this->m_MunTyp).m_ui8EntityKind = MunitionType->m_ui8EntityKind;
  (this->m_MunTyp).m_ui8Domain = KVar3;
  (this->m_MunTyp).m_ui16Country = KVar2;
  (this->m_MunTyp).m_ui8Category = KVar4;
  (this->m_MunTyp).m_ui8SubCategory = KVar5;
  (this->m_MunTyp).m_ui8Specific = KVar6;
  (this->m_MunTyp).m_ui8Extra = KVar7;
  (this->m_ShotStartTime).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_00217800;
  KVar8 = ShotStartTime->m_ui32TimePastHour;
  (this->m_ShotStartTime).m_i32Hour = ShotStartTime->m_i32Hour;
  (this->m_ShotStartTime).m_ui32TimePastHour = KVar8;
  this->m_f32CumulativeShotTime = CumulativeShotTime;
  (this->m_EmitterLoc).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_00218190;
  KVar9 = EmitterLocation->m_f32Y;
  (this->m_EmitterLoc).m_f32X = EmitterLocation->m_f32X;
  (this->m_EmitterLoc).m_f32Y = KVar9;
  (this->m_EmitterLoc).m_f32Z = EmitterLocation->m_f32Z;
  this->m_f32AperDiameter = ApertureDiameter;
  this->m_f32Wavelength = Wavelength;
  this->m_f32PeakIrradiance = PeakIrradiance;
  this->m_f32PulseRepFreq = PulseRepetitionFrequency;
  this->m_f32PulseWidth = PulseWidth;
  this->m_ui8PulseShp = (undefined1)PS;
  *(undefined8 *)&this->m_ui8Padding1 = 0;
  *(undefined8 *)((long)&this->m_ui16NumDERecs + 1) = 0;
  *(undefined8 *)
   ((long)&(this->m_vDeRec).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 7) = 0;
  *(undefined8 *)
   ((long)&(this->m_vDeRec).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 7) = 0;
  *(undefined1 *)
   ((long)&(this->m_vDeRec).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7) = 0;
  (this->super_Header).super_Header6.m_ui8PDUType = 'D';
  (this->super_Header).super_Header6.m_ui8ProtocolFamily = '\x02';
  (this->super_Header).super_Header6.m_ui16PDULength = 0x58;
  (this->super_Header).super_Header6.m_ui8ProtocolVersion = '\a';
  uVar1 = this->m_DeUnion;
  (this->m_DeUnion).m_ui16Flags = (ushort)WeaponState + (ushort)UpdateState * 2 | uVar1 & 0xfffc;
  return;
}

Assistant:

Directed_Energy_Fire_PDU::Directed_Energy_Fire_PDU( const EntityIdentifier & FireID, const EntityIdentifier & EventID,
                                                    const EntityType & MunitionType, const ClockTime & ShotStartTime,
                                                    KFLOAT32 CumulativeShotTime, const Vector & EmitterLocation,
                                                    KFLOAT32 ApertureDiameter, KFLOAT32 Wavelength, KFLOAT32 PeakIrradiance,
                                                    KFLOAT32 PulseRepetitionFrequency, KFLOAT32 PulseWidth,
                                                    KBOOL WeaponState, KBOOL UpdateState, BeamSpotShape PS ) :
    m_FiringEntityID( FireID ),
    m_EventID( EventID ),
    m_MunTyp( MunitionType ),
    m_ShotStartTime( ShotStartTime ),
    m_f32CumulativeShotTime( CumulativeShotTime ),
    m_EmitterLoc( EmitterLocation ),
    m_f32AperDiameter( ApertureDiameter ),
    m_f32Wavelength( Wavelength ),
    m_f32PeakIrradiance( PeakIrradiance ),
    m_f32PulseRepFreq( PulseRepetitionFrequency ),
    m_f32PulseWidth( PulseWidth ),
    m_ui8PulseShp( PS ),
    m_ui8Padding1( 0 ),
    m_ui32Padding2( 0 ),
    m_ui16Padding3( 0 ),
    m_ui16NumDERecs( 0 )
{
    m_ui8PDUType = DirectedEnergyFire_PDU_Type;
    m_ui16PDULength = DIRECTED_ENERGY_PDU_SIZE;
    m_ui8ProtocolFamily = Warfare;
    m_ui8ProtocolVersion = IEEE_1278_1_2012;
    m_DeUnion.m_ui16WeaponState = WeaponState;
    m_DeUnion.m_ui16StateUpdate = UpdateState;
}